

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f-call-cxx.cpp
# Opt level: O1

void __thiscall TwoDArray::TwoDArray(TwoDArray *this,int n0,int n1)

{
  int **ppiVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->n0_ = n0;
  this->n1_ = n1;
  this->array_ = (int **)0x0;
  uVar3 = (long)n0 * 8;
  if (n0 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppiVar1 = (int **)operator_new__(uVar3);
  this->array_ = ppiVar1;
  if (0 < n0) {
    uVar3 = (long)n1 << 2;
    if (n1 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar4 = 0;
    do {
      piVar2 = (int *)operator_new__(uVar3);
      this->array_[uVar4] = piVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)n0 != uVar4);
  }
  return;
}

Assistant:

TwoDArray::TwoDArray(int n0, int n1) {
  int i;
  n0_ = n0;
  n1_ = n1;
  array_ = NULL;
  array_ = new int*[n0];
  for (i = 0; i < n0; i++) {
    array_[i] = new int[n1];
  }
}